

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::parseReal(char **token,real_t *out)

{
  bool bVar1;
  double in_RAX;
  size_t sVar2;
  char *pcVar3;
  double val;
  double local_28;
  
  pcVar3 = *token;
  local_28 = in_RAX;
  sVar2 = strspn(pcVar3," \t");
  pcVar3 = pcVar3 + sVar2;
  *token = pcVar3;
  sVar2 = strcspn(pcVar3," \t\r");
  bVar1 = tryParseDouble(pcVar3,pcVar3 + sVar2,&local_28);
  if (bVar1) {
    *out = (float)local_28;
  }
  *token = pcVar3 + sVar2;
  return bVar1;
}

Assistant:

static inline bool parseReal(const char **token, real_t *out) {
  (*token) += strspn((*token), " \t");
  const char *end = (*token) + strcspn((*token), " \t\r");
  double val;
  bool ret = tryParseDouble((*token), end, &val);
  if (ret) {
    real_t f = static_cast<real_t>(val);
    (*out) = f;
  }
  (*token) = end;
  return ret;
}